

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMultiProcessHandler::CheckCycles(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  cmCTest *pcVar2;
  ostream *poVar3;
  _Elt_pointer piVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  mapped_type *ppcVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int root;
  int test;
  _Base_ptr local_268;
  _Base_ptr local_260;
  PropertiesMap *local_258;
  TestMap *local_250;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Checking test dependency graph...");
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x586,(char *)s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_map,this->Quiet);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  local_250 = &this->Tests;
  local_260 = (this->Tests).
              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_268 = &(this->Tests).
               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var1 = &visited._M_t._M_impl.super__Rb_tree_header;
  local_258 = &this->Properties;
  do {
    if (local_260 == local_268) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Checking test dependency graph end");
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x5a3,(char *)s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                  super__Deque_impl_data._M_map,this->Quiet);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_00479aee:
      return local_260 == local_268;
    }
    root = local_260[1]._M_color;
    visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::stack<int,std::deque<int,std::allocator<int>>>::
    stack<std::deque<int,std::allocator<int>>,void>(&s);
    std::deque<int,_std::allocator<int>_>::push_back((deque<int,_std::allocator<int>_> *)&s,&root);
    while (s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
           ._M_cur !=
           s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
           _M_cur) {
      piVar4 = s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_cur;
      if (s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
          _M_cur == s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                    _M_finish._M_first) {
        piVar4 = s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_node[-1] + 0x80;
      }
      test = piVar4[-1];
      std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&s);
      pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&visited,&test);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pmVar5 = std::
                 map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                 ::operator[](&local_250->
                               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                              ,&test);
        for (p_Var6 = (pmVar5->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 !=
            &(pmVar5->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
             super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          if (p_Var6[1]._M_color == root) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                                     "Error: a cycle exists in the test dependency graph for the test \""
                                    );
            ppcVar7 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&local_258->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,&root);
            poVar3 = std::operator<<(poVar3,(string *)*ppcVar7);
            std::operator<<(poVar3,"\".\nPlease fix the cycle and run ctest again.\n");
            pcVar2 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x599,local_1c8[0],false);
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                      ((_Deque_base<int,_std::allocator<int>_> *)&s);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&visited._M_t);
            goto LAB_00479aee;
          }
          std::deque<int,_std::allocator<int>_>::push_back
                    ((deque<int,_std::allocator<int>_> *)&s,(value_type_conflict1 *)(p_Var6 + 1));
        }
      }
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&s);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&visited._M_t);
    local_260 = (_Base_ptr)std::_Rb_tree_increment(local_260);
  } while( true );
}

Assistant:

bool cmCTestMultiProcessHandler::CheckCycles()
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph..." << std::endl,
                     this->Quiet);
  for (auto const& it : this->Tests) {
    // DFS from each element to itself
    int root = it.first;
    std::set<int> visited;
    std::stack<int> s;
    s.push(root);
    while (!s.empty()) {
      int test = s.top();
      s.pop();
      if (visited.insert(test).second) {
        for (auto const& d : this->Tests[test]) {
          if (d == root) {
            // cycle exists
            cmCTestLog(
              this->CTest, ERROR_MESSAGE,
              "Error: a cycle exists in the test dependency graph "
              "for the test \""
                << this->Properties[root]->Name
                << "\".\nPlease fix the cycle and run ctest again.\n");
            return false;
          }
          s.push(d);
        }
      }
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph end" << std::endl,
                     this->Quiet);
  return true;
}